

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

int add_certificate_to_store(TLS_IO_INSTANCE *tls_io_instance,char *certValue)

{
  uint uVar1;
  int iVar2;
  X509_STORE *ctx;
  BIO_METHOD *type;
  BIO *bp;
  size_t sVar3;
  X509 *x;
  char *message;
  
  if (certValue == (char *)0x0) {
    return 0;
  }
  ctx = SSL_CTX_get_cert_store((SSL_CTX *)tls_io_instance->ssl_context);
  if (ctx == (X509_STORE *)0x0) {
    log_ERR_get_error("failure in SSL_CTX_get_cert_store.");
    return 0x3c2;
  }
  type = BIO_s_mem();
  if (type == (BIO_METHOD *)0x0) {
    log_ERR_get_error("failure in BIO_s_mem");
    return 0x3cf;
  }
  bp = BIO_new(type);
  if (bp == (BIO *)0x0) {
    log_ERR_get_error("failure in BIO_new");
    return 0x3d8;
  }
  uVar1 = BIO_puts(bp,certValue);
  if ((int)uVar1 < 0) {
    iVar2 = 0x3e0;
    message = "failure in BIO_puts";
  }
  else {
    sVar3 = strlen(certValue);
    if (sVar3 == uVar1) {
      iVar2 = 0;
      x = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (x != (X509 *)0x0) {
        message = "failure in X509_STORE_add_cert";
        do {
          iVar2 = X509_STORE_add_cert(ctx,x);
          X509_free(x);
          if (iVar2 == 0) {
            iVar2 = 0x3fd;
            goto LAB_0010bd5b;
          }
          iVar2 = 0;
          x = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
        } while (x != (X509 *)0x0);
      }
      goto LAB_0010bd63;
    }
    iVar2 = 999;
    message = "mismatching legths";
  }
LAB_0010bd5b:
  log_ERR_get_error(message);
LAB_0010bd63:
  BIO_free(bp);
  return iVar2;
}

Assistant:

static int add_certificate_to_store(TLS_IO_INSTANCE* tls_io_instance, const char* certValue)
{
    int result = 0;

    if (certValue != NULL)
    {
        X509_STORE* cert_store = SSL_CTX_get_cert_store(tls_io_instance->ssl_context);
        if (cert_store == NULL)
        {
            log_ERR_get_error("failure in SSL_CTX_get_cert_store.");
            result = MU_FAILURE;
        }
        else
        {
#if (OPENSSL_VERSION_NUMBER >= 0x10100000L) || defined(LIBRESSL_VERSION_NUMBER)
            const BIO_METHOD* bio_method;
#else
            BIO_METHOD* bio_method;
#endif
            bio_method = BIO_s_mem();
            if (bio_method == NULL)
            {
                log_ERR_get_error("failure in BIO_s_mem");
                result = MU_FAILURE;
            }
            else
            {
                BIO* cert_memory_bio = BIO_new(bio_method);

                if (cert_memory_bio == NULL)
                {
                    log_ERR_get_error("failure in BIO_new");
                    result = MU_FAILURE;
                }
                else
                {
                    int puts_result = BIO_puts(cert_memory_bio, certValue);
                    if (puts_result < 0)
                    {
                        log_ERR_get_error("failure in BIO_puts");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if ((size_t)puts_result != strlen(certValue))
                        {
                            log_ERR_get_error("mismatching legths");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            X509* certificate;
                            while ((certificate = PEM_read_bio_X509(cert_memory_bio, NULL, NULL, NULL)) != NULL)
                            {
                                if (!X509_STORE_add_cert(cert_store, certificate))
                                {
                                    X509_free(certificate);
                                    log_ERR_get_error("failure in X509_STORE_add_cert");
                                    break;
                                }
                                X509_free(certificate);
                            }
                            if (certificate == NULL)
                            {
                                result = 0;/*all is fine*/
                            }
                            else
                            {
                                /*previous while loop terminated unfortunately*/
                                result = MU_FAILURE;
                            }
                        }
                    }
                    BIO_free(cert_memory_bio);
                }
            }
        }
    }
    return result;
}